

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

byte * __thiscall
Js::ByteCodeBufferReader::ReadReferencedPropertyIdMap
          (ByteCodeBufferReader *this,byte *current,FunctionBody *function)

{
  Type pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  uint mapIndex;
  long lVar5;
  int local_38;
  uint32 local_34;
  int value;
  
  local_34 = FunctionBody::GetCountField(function,ReferencedPropertyIdCount);
  if (local_34 != 0) {
    FunctionBody::CreateReferencedPropertyIdMap(function);
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    mapIndex = 0;
    do {
      current = ReadInt32(current,(size_t)(this->raw + ((long)this->totalSize - (long)current)),
                          &local_38);
      pBVar1 = function->byteCodeCache;
      lVar5 = (long)local_38;
      if (pBVar1->propertyCount <= local_38) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                    ,0xa2,"(realOffset<propertyCount)","realOffset<propertyCount");
        if (!bVar3) goto LAB_00894230;
        *puVar4 = 0;
      }
      if (pBVar1->propertyIds[lVar5] == -1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                    ,0xa3,"(propertyIds[realOffset]!=-1)",
                                    "propertyIds[realOffset]!=-1");
        if (!bVar3) {
LAB_00894230:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      FunctionBody::SetReferencedPropertyIdWithMapIndex
                (function,mapIndex,pBVar1->propertyIds[lVar5]);
      mapIndex = mapIndex + 1;
    } while (local_34 != mapIndex);
    FunctionBody::VerifyReferencedPropertyIdMap(function);
  }
  return current;
}

Assistant:

const byte * ReadReferencedPropertyIdMap(const byte * current, FunctionBody * function)
    {
        uint count = function->GetReferencedPropertyIdCount();
        if (count == 0)
        {
            return current;
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int constant;
        current = ReadInt32(current, &constant);
        Assert(constant == magicStartOfReferencedPropIdMap);
#endif

        function->CreateReferencedPropertyIdMap();

        for (uint i = 0; i < count; i++)
        {
            int value;
            current = ReadInt32(current, &value);
            PropertyId propertyId = function->GetByteCodeCache()->LookupNonBuiltinPropertyId(value);
            function->SetReferencedPropertyIdWithMapIndex(i, propertyId);
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        current = ReadInt32(current, &constant);
        Assert(constant == magicEndOfReferencedPropIdMap);
#endif
#if DBG
        function->VerifyReferencedPropertyIdMap();
#endif
        return current;
    }